

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_.cpp
# Opt level: O1

void __thiscall vector_<char>::resize(vector_<char> *this)

{
  size_t sVar1;
  char *pcVar2;
  ulong __n;
  char *__s;
  size_t sVar3;
  
  __n = this->capacity * 2;
  this->capacity = __n;
  __s = (char *)operator_new__(__n);
  memset(__s,0,__n);
  sVar1 = this->_size;
  if (sVar1 != 0) {
    pcVar2 = (this->arr)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl;
    sVar3 = 0;
    do {
      __s[sVar3] = pcVar2[sVar3];
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  pcVar2 = (this->arr)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
  (this->arr)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = __s;
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
    return;
  }
  return;
}

Assistant:

void resize() {
        capacity *= 2;
        auto temp = make_unique<T[]>(capacity);
        for (int i = 0; i < _size; i++) {
            temp[i] = arr[i];
        }
        arr = std::move(temp);
    }